

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O2

void __thiscall Func::SetDoFastPaths(Func *this)

{
  code *pcVar1;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar3;
  uint uVar4;
  
  if ((this->field_0x242 & 0x10) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x374,"(!this->hasCalledSetDoFastPaths)","!this->hasCalledSetDoFastPaths");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  sourceContextId = GetSourceContextId(this);
  functionId = GetLocalFunctionId(this);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,FastPathPhase,sourceContextId,functionId);
  uVar4 = 0x100000;
  if (!bVar2) {
    bVar2 = IsSimpleJit(this);
    if ((!bVar2) || (DAT_01441e6c == '\x01')) {
      uVar4 = 0x100008;
    }
  }
  *(uint *)&this->field_0x240 = *(uint *)&this->field_0x240 & 0xffeffff7 | uVar4;
  return;
}

Assistant:

void
Func::SetDoFastPaths()
{
    // Make sure we only call this once!
    Assert(!this->hasCalledSetDoFastPaths);

    bool doFastPaths = false;

    if(!PHASE_OFF(Js::FastPathPhase, this) && (!IsSimpleJit() || CONFIG_FLAG(NewSimpleJit)))
    {
        doFastPaths = true;
    }

    this->m_doFastPaths = doFastPaths;
#ifdef DBG
    this->hasCalledSetDoFastPaths = true;
#endif
}